

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QEventPoint * __thiscall QMap<int,_QEventPoint>::operator[](QMap<int,_QEventPoint> *this,int *key)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_int,_QEventPoint> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QEventPoint>_>,_bool> pVar3;
  iterator i;
  QMap<int,_QEventPoint> copy;
  map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>
  *in_stack_ffffffffffffff68;
  QEventPoint *pQVar4;
  QMap<int,_QEventPoint> *in_stack_ffffffffffffff70;
  map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>
  *this_00;
  map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>
  local_48;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff70->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff70,(QMap<int,_QEventPoint> *)in_stack_ffffffffffffff68);
  }
  else {
    memset(&local_48._M_t._M_impl.super__Rb_tree_header._M_node_count,0,8);
    QMap((QMap<int,_QEventPoint> *)0x9e08a3);
  }
  detach(in_stack_ffffffffffffff70);
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
                *)0x9e08c3);
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       std::
       map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>::
       find(in_stack_ffffffffffffff68,(key_type *)0x9e08d4);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
                *)0x9e08e3);
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>::
       end(in_stack_ffffffffffffff68);
  bVar1 = std::operator==((_Self *)&local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                          (_Self *)&local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
                  *)0x9e0916);
    this_00 = &local_48;
    QEventPoint::QEventPoint((QEventPoint *)this_00,-1,(QPointingDevice *)0x0);
    std::pair<const_int,_QEventPoint>::pair<QEventPoint,_true>
              (in_RSI,(int *)in_stack_ffffffffffffff68,(QEventPoint *)0x9e095a);
    pVar3 = std::
            map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>
            ::insert(this_00,in_RSI);
    local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    std::pair<const_int,_QEventPoint>::~pair((pair<const_int,_QEventPoint> *)0x9e09a1);
    QEventPoint::~QEventPoint((QEventPoint *)&local_48);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_QEventPoint>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_QEventPoint>_> *)0x9e09b5);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<int,_QEventPoint> *)0x9e09c7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }